

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::gestureEventHandler(QGraphicsScenePrivate *this,QGestureEvent *event)

{
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *pQVar1;
  long lVar2;
  long lVar3;
  Span *pSVar4;
  Span *pSVar5;
  const_iterator first;
  QGesture *this_00;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  QGesture **ppQVar11;
  bool bVar12;
  bool bVar13;
  GestureState GVar14;
  GestureType GVar15;
  QFlags<Qt::GestureFlag> QVar16;
  GestureCancelPolicy GVar17;
  QWidget *pQVar18;
  QGraphicsView *this_01;
  QPoint QVar19;
  QHash<QGesture_*,_QGraphicsObject_*> *this_02;
  QGraphicsObject *pQVar20;
  iterator iVar21;
  iterator iVar22;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar23;
  QSet<QGesture_*> *pQVar24;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *this_03;
  Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *pDVar25;
  undefined1 *puVar26;
  QGraphicsObject **ppQVar27;
  QGraphicsItem *pQVar28;
  long lVar29;
  ulong uVar30;
  qreal *pqVar31;
  QTransform *pQVar32;
  int i;
  int iVar33;
  int iVar34;
  long lVar35;
  QList<QGraphicsObject_*> *pQVar36;
  ulong uVar37;
  long in_FS_OFFSET;
  byte bVar38;
  qreal qVar39;
  QGraphicsObject *obj;
  GestureType gestureType;
  QHash<QGesture_*,_QHashDummyValue> local_1f0 [2];
  QGesture *gesture_2;
  QGesture *g_1;
  ulong uStack_1d0;
  QGesture *g;
  QSet<QGesture_*> gestures;
  QSet<QGesture_*> gestures_2;
  QHash<QGesture_*,_QHashDummyValue> local_1a8;
  QHash<QGesture_*,_QHashDummyValue> local_1a0;
  QArrayDataPointer<QGesture_*> local_198;
  QSet<QGesture_*> gestures_1;
  Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *pDStack_170;
  QGesture *gesture;
  QGraphicsObject **ppQStack_120;
  QGestureEvent ev;
  QTransform toScene;
  
  bVar38 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar18 = QGestureEvent::widget(event);
  if ((pQVar18 != (QWidget *)0x0) &&
     (this_01 = (QGraphicsView *)
                QtPrivate::qobject_cast_helper<QGraphicsView*,QObject>
                          (*(QObject **)(*(long *)&pQVar18->field_0x8 + 0x10)),
     this_01 != (QGraphicsView *)0x0)) {
    local_198.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_198.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_198.ptr = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
    QGestureEvent::gestures((QList<QGesture_*> *)&local_198,event);
    local_1a0.d = (Data *)0x0;
    toScene.m_matrix[0][0] = 0.0;
    QVar19 = QWidget::mapFromGlobal(pQVar18,(QPoint *)&toScene);
    pqVar31 = (qreal *)&DAT_006795c0;
    pQVar32 = &toScene;
    for (lVar29 = 10; lVar29 != 0; lVar29 = lVar29 + -1) {
      pQVar32->m_matrix[0][0] = *pqVar31;
      pqVar31 = pqVar31 + (ulong)bVar38 * -2 + 1;
      pQVar32 = (QTransform *)((long)pQVar32 + ((ulong)bVar38 * -2 + 1) * 8);
    }
    QTransform::fromTranslate((double)QVar19.xp.m_i.m_i,(double)QVar19.yp.m_i.m_i);
    QGraphicsView::viewportTransform((QTransform *)&gestures_1,this_01);
    QTransform::inverted((bool *)&gesture);
    QTransform::operator*(&toScene,(QTransform *)&ev);
    ppQVar11 = local_198.ptr;
    this_02 = &this->gestureTargets;
    lVar35 = local_198.size << 3;
    for (lVar29 = 0; lVar35 != lVar29; lVar29 = lVar29 + 8) {
      gesture = (QGesture *)
                *(Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> **)
                 ((long)ppQVar11 + lVar29);
      bVar12 = QGesture::hasHotSpot
                         ((QGesture *)
                          *(Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> **)
                           ((long)ppQVar11 + lVar29));
      if (bVar12) {
        ev._0_16_ = QGesture::hotSpot(gesture);
        qVar39 = ev._8_8_;
        uVar6 = QTransform::map((QPointF *)&toScene);
        lVar3 = *(long *)&gesture->field_0x8;
        *(undefined8 *)(lVar3 + 0x90) = uVar6;
        *(qreal *)(lVar3 + 0x98) = qVar39;
      }
      else {
        lVar3 = *(long *)&gesture->field_0x8;
        *(undefined8 *)(lVar3 + 0x90) = 0;
        *(undefined8 *)(lVar3 + 0x98) = 0;
      }
      auVar10._8_8_ = 0;
      auVar10._0_8_ = ev._8_8_;
      ev._0_16_ = auVar10 << 0x40;
      pQVar20 = QHash<QGesture_*,_QGraphicsObject_*>::value
                          (this_02,&gesture,(QGraphicsObject **)&ev);
      if (pQVar20 == (QGraphicsObject *)0x0) {
        GVar14 = QGesture::state(gesture);
        if (GVar14 == GestureStarted) {
          QSet<QGesture_*>::insert((QSet<QGesture_*> *)&ev,(QGesture **)&local_1a0);
        }
      }
    }
    if ((local_1a0.d != (Data *)0x0) && ((local_1a0.d)->size != 0)) {
      local_1a8.d = (Data *)0x0;
      gestures_2.q_hash.d = (Hash)(Data *)0x0;
      pQVar1 = &this->cachedItemGestures;
      gestureTargetsAtHotSpots
                (this,(QSet<QGesture_*> *)&local_1a0,0,pQVar1,(QSet<QGraphicsObject_*> *)0x0,
                 (QSet<QGesture_*> *)&local_1a8,&gestures_2);
      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::keys((QList<QGraphicsObject_*> *)&ev,pQVar1);
      pQVar36 = &this->cachedTargetItems;
      QArrayDataPointer<QGraphicsObject_*>::operator=
                (&pQVar36->d,(QArrayDataPointer<QGraphicsObject_*> *)&ev);
      QArrayDataPointer<QGraphicsObject_*>::~QArrayDataPointer
                ((QArrayDataPointer<QGraphicsObject_*> *)&ev);
      iVar21 = QList<QGraphicsObject_*>::begin(pQVar36);
      iVar22 = QList<QGraphicsObject_*>::end(pQVar36);
      std::
      __sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (iVar21,iVar22,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x581e1c);
      if ((gestures_2.q_hash.d != (Data *)0x0) && (*(long *)((long)gestures_2.q_hash.d + 8) != 0)) {
        for (uVar37 = 0; uVar37 < (ulong)(this->cachedTargetItems).d.size; uVar37 = uVar37 + 1) {
          gestures_1.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
          pDStack_170 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                        &DAT_aaaaaaaaaaaaaaaa;
          QPointer<QGraphicsObject>::QPointer<void>
                    ((QPointer<QGraphicsObject> *)&gestures_1,
                     (this->cachedTargetItems).d.ptr[uVar37]);
          gestures.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
          if ((gestures_1.q_hash.d == (Data *)0x0) || (*(int *)((long)gestures_1.q_hash.d + 4) == 0)
             ) {
            pDVar23 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
          }
          else {
            pDVar23 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)
                      &DAT_aaaaaaaaaaaaaaaa;
          }
          gesture = (QGesture *)pDVar23;
          QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                    ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)&ev,(QGraphicsObject **)pQVar1);
          operator&(&gestures,&gestures_2);
          QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&ev);
          if ((gestures.q_hash.d != (Data *)0x0) && (*(long *)((long)gestures.q_hash.d + 8) != 0)) {
            ev.m_accepted.d.d.ptr =
                 (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
                  )&DAT_aaaaaaaaaaaaaaaa;
            ev.m_targetWidgets.d.d.ptr =
                 (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
                  )&DAT_aaaaaaaaaaaaaaaa;
            ev.m_gestures.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            ev.m_widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
            ev.m_gestures.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            ev.m_gestures.d.ptr = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
            ev._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            ev._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QSet<QGesture_*>::values
                      ((QList<QGesture_*> *)&gesture,(QSet<QGesture_*> *)&gestures.q_hash);
            QGestureEvent::QGestureEvent(&ev,(QList<QGesture_*> *)&gesture);
            QArrayDataPointer<QGesture_*>::~QArrayDataPointer
                      ((QArrayDataPointer<QGesture_*> *)&gesture);
            ev._8_2_ = 0xca;
            pQVar18 = QGestureEvent::widget(event);
            QGestureEvent::setWidget(&ev,pQVar18);
            ev._12_1_ = 0;
            ppQStack_120 = (QGraphicsObject **)&DAT_aaaaaaaaaaaaaaaa;
            gesture = (QGesture *)&DAT_aaaaaaaaaaaaaaaa;
            _gesture = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&gestures.q_hash);
            while( true ) {
              if (gesture == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
                  gesture._8_8_ == 0) break;
              pSVar4 = gesture->spans;
              uVar30 = gesture._8_8_ >> 7;
              QGestureEvent::setAccepted
                        (&ev,*(QGesture **)
                              pSVar4[uVar30].entries[pSVar4[uVar30].offsets[gesture._8_4_ & 0x7f]].
                              storage.data,false);
              QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                        ((iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&gesture);
            }
            if (gestures_1.q_hash.d == (Data *)0x0) {
              pDVar25 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0;
            }
            else {
              pDVar25 = pDStack_170;
              if (*(int *)((long)gestures_1.q_hash.d + 4) == 0) {
                pDVar25 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0;
              }
            }
            pQVar28 = (QGraphicsItem *)&pDVar25->numBuckets;
            if (pDVar25 == (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0) {
              pQVar28 = (QGraphicsItem *)0x0;
            }
            sendEvent(this,pQVar28,&ev.super_QEvent);
            ppQStack_120 = (QGraphicsObject **)&DAT_aaaaaaaaaaaaaaaa;
            gesture = (QGesture *)&DAT_aaaaaaaaaaaaaaaa;
            _gesture = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&gestures.q_hash);
            while( true ) {
              if (gesture == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
                  gesture._8_8_ == 0) break;
              pSVar4 = gesture->spans;
              uVar30 = gesture._8_8_ >> 7;
              g = *(QGesture **)
                   pSVar4[uVar30].entries[pSVar4[uVar30].offsets[gesture._8_4_ & 0x7f]].storage.data
              ;
              if ((ev._12_1_ != '\0') || (bVar12 = QGestureEvent::isAccepted(&ev,g), bVar12)) {
                QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                          ((QHash<QGesture*,QHashDummyValue> *)&gestures_2,&g);
                bVar12 = QPointer::operator_cast_to_bool((QPointer *)&gestures_1);
                if (bVar12) {
                  if ((gestures_1.q_hash.d == (Data *)0x0) ||
                     (pDVar25 = pDStack_170, *(int *)((long)gestures_1.q_hash.d + 4) == 0)) {
                    pDVar25 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0
                    ;
                  }
                  g_1 = (QGesture *)pDVar25;
                  QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                            ((QHash<QGesture*,QGraphicsObject*> *)this_02,&g,
                             (QGraphicsObject **)&g_1);
                  _g_1 = (piter)ZEXT816(0);
                  _g_1 = (piter)QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::begin(pQVar1);
                  while( true ) {
                    if (g_1 == (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                               0x0 && g_1._8_8_ == 0) break;
                    pSVar5 = g_1->spans;
                    uVar30 = g_1._8_8_ >> 7;
                    QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                              ((QHash<QGesture*,QHashDummyValue> *)
                               (pSVar5[uVar30].entries[pSVar5[uVar30].offsets[g_1._8_4_ & 0x7f]].
                                storage.data + 8),&g);
                    QHashPrivate::
                    iterator<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_>::operator++
                              ((iterator<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_>
                                *)&g_1);
                  }
                  if ((gestures_1.q_hash.d == (Data *)0x0) ||
                     (gesture_2 = (QGesture *)pDStack_170,
                     *(int *)((long)gestures_1.q_hash.d + 4) == 0)) {
                    gesture_2 = (QGesture *)
                                (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                                0x0;
                  }
                  pQVar24 = QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
                                      (pQVar1,(QGraphicsObject **)&gesture_2);
                  QSet<QGesture_*>::insert((QSet<QGesture_*> *)local_1f0,(QGesture **)pQVar24);
                }
              }
              bVar12 = QHash<QGesture_*,_QGraphicsObject_*>::contains(this_02,&g);
              if ((!bVar12) &&
                 (bVar12 = QPointer::operator_cast_to_bool((QPointer *)&gestures_1), bVar12)) {
                if ((gestures_1.q_hash.d == (Data *)0x0) ||
                   (pDVar25 = pDStack_170, *(int *)((long)gestures_1.q_hash.d + 4) == 0)) {
                  pDVar25 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0;
                }
                g_1 = (QGesture *)pDVar25;
                QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                          ((QHash<QGesture*,QGraphicsObject*> *)this_02,&g,(QGraphicsObject **)&g_1)
                ;
              }
              QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                        ((iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&gesture);
            }
            if ((gestures_2.q_hash.d == (Data *)0x0) ||
               (*(long *)((long)gestures_2.q_hash.d + 8) == 0)) {
              QGestureEvent::~QGestureEvent(&ev);
              QHash<QGesture_*,_QHashDummyValue>::~QHash(&gestures.q_hash);
              QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&gestures_1);
              break;
            }
            QGestureEvent::~QGestureEvent(&ev);
          }
          QHash<QGesture_*,_QHashDummyValue>::~QHash(&gestures.q_hash);
          QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&gestures_1);
        }
      }
      if ((local_1a8.d != (Data *)0x0) && ((local_1a8.d)->size != 0)) {
        uVar37 = 0;
        while (((uVar37 < (ulong)(this->cachedTargetItems).d.size && (local_1a8.d != (Data *)0x0))
               && ((local_1a8.d)->size != 0))) {
          gesture = (QGesture *)(this->cachedTargetItems).d.ptr[uVar37];
          gestures_1.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
          QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                    ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)&gestures_1,
                     (QGraphicsObject **)pQVar1);
          ev._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          ev._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          ev._0_16_ = QHash<QGesture_*,_QHashDummyValue>::begin
                                ((QHash<QGesture_*,_QHashDummyValue> *)&gestures_1);
          while( true ) {
            if (ev._0_8_ == 0 && ev._8_8_ == 0) break;
            lVar29 = *(long *)(ev._0_8_ + 0x20);
            lVar35 = (ev._8_8_ >> 7) * 0x90;
            g_1 = (QGesture *)
                  *(Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> **)
                   (*(long *)(lVar29 + 0x80 + lVar35) +
                   (ulong)*(byte *)((ulong)(ev._8_4_ & 0x7f) + lVar29 + lVar35) * 8);
            bVar12 = QHash<QGesture_*,_QGraphicsObject_*>::contains(this_02,&g_1);
            if (!bVar12) {
              QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                        ((QHash<QGesture*,QGraphicsObject*> *)this_02,&g_1,
                         (QGraphicsObject **)&gesture);
              QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                        ((QHash<QGesture*,QHashDummyValue> *)&local_1a8,&g_1);
            }
            QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                      ((iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&ev);
          }
          QHash<QGesture_*,_QHashDummyValue>::~QHash
                    ((QHash<QGesture_*,_QHashDummyValue> *)&gestures_1);
          uVar37 = uVar37 + 1;
        }
      }
      QHash<QGesture_*,_QHashDummyValue>::~QHash(&gestures_2.q_hash);
      QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a8);
    }
    ppQVar11 = local_198.ptr;
    local_1f0[0].d = (Data *)0x0;
    local_1a8.d = (Data *)0x0;
    pQVar1 = &this->cachedItemGestures;
    pQVar36 = &this->cachedTargetItems;
    lVar29 = local_198.size << 3;
    for (lVar35 = 0; lVar29 != lVar35; lVar35 = lVar35 + 8) {
      gesture = (QGesture *)
                *(Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> **)
                 ((long)ppQVar11 + lVar35);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = ev._8_8_;
      ev._0_16_ = auVar7 << 0x40;
      gestures_1.q_hash.d =
           (Hash)QHash<QGesture_*,_QGraphicsObject_*>::value
                           (this_02,&gesture,(QGraphicsObject **)&ev);
      if (gestures_1.q_hash.d != (Data *)0x0) {
        pQVar24 = QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
                            (pQVar1,(QGraphicsObject **)&gestures_1);
        QSet<QGesture_*>::insert((QSet<QGesture_*> *)&ev,(QGesture **)pQVar24);
        QList<QGraphicsObject_*>::append(pQVar36,(parameter_type)gestures_1.q_hash.d);
        QSet<QGesture_*>::insert((QSet<QGesture_*> *)&ev,(QGesture **)local_1f0);
        lVar3 = *(long *)((long)gestures_1.q_hash.d + 0x18);
        GVar15 = QGesture::gestureType(gesture);
        ev._0_4_ = GVar15;
        auVar8._12_4_ = 0;
        auVar8._0_12_ = stack0xfffffffffffffe2c;
        _g_1 = (piter)(auVar8 << 0x20);
        QVar16 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::value
                           ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)(lVar3 + 0x158),
                            (GestureType *)&ev,(QFlags<Qt::GestureFlag> *)&g_1);
        if (((uint)QVar16.super_QFlagsStorageHelper<Qt::GestureFlag,_4>.
                   super_QFlagsStorage<Qt::GestureFlag>.i & 4) != 0) {
          QSet<QGesture_*>::insert((QSet<QGesture_*> *)&ev,(QGesture **)&local_1a8);
        }
      }
    }
    iVar21 = QList<QGraphicsObject_*>::begin(pQVar36);
    iVar22 = QList<QGraphicsObject_*>::end(pQVar36);
    std::
    __sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
              (iVar21,iVar22,
               (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x581e1c);
    this_03 = &this->cachedAlreadyDeliveredGestures;
    iVar34 = 0;
    while( true ) {
      if ((this->cachedTargetItems).d.size <= (long)iVar34) break;
      gestures_1.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
      pDStack_170 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                    &DAT_aaaaaaaaaaaaaaaa;
      QPointer<QGraphicsObject>::QPointer<void>
                ((QPointer<QGraphicsObject> *)&gestures_1,(this->cachedTargetItems).d.ptr[iVar34]);
      gestures_2.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
      if ((gestures_1.q_hash.d == (Data *)0x0) || (*(int *)((long)gestures_1.q_hash.d + 4) == 0)) {
        pDVar25 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0;
      }
      else {
        pDVar25 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                  &DAT_aaaaaaaaaaaaaaaa;
      }
      g_1 = (QGesture *)pDVar25;
      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)&gesture,(QGraphicsObject **)pQVar1)
      ;
      operator&((QSet<QGesture_*> *)&ev,(QSet<QGesture_*> *)local_1f0);
      if ((gestures_1.q_hash.d == (Data *)0x0) || (*(int *)((long)gestures_1.q_hash.d + 4) == 0)) {
        g = (QGesture *)0x0;
      }
      else {
        g = (QGesture *)&DAT_aaaaaaaaaaaaaaaa;
      }
      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)&gestures,
                 (QGraphicsObject **)this_03);
      operator-(&gestures_2,(QSet<QGesture_*> *)&ev);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&gestures);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&ev);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&gesture);
      if ((gestures_2.q_hash.d == (Data *)0x0) || (*(long *)((long)gestures_2.q_hash.d + 8) == 0)) {
        QHash<QGesture_*,_QHashDummyValue>::~QHash(&gestures_2.q_hash);
        QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&gestures_1);
      }
      else {
        if ((gestures_1.q_hash.d == (Data *)0x0) || (*(int *)((long)gestures_1.q_hash.d + 4) == 0))
        {
          puVar26 = (undefined1 *)0x0;
        }
        else {
          puVar26 = &DAT_aaaaaaaaaaaaaaaa;
        }
        ev._0_8_ = puVar26;
        pQVar24 = QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
                            (this_03,(QGraphicsObject **)&ev);
        QSet<QGesture_*>::unite(pQVar24,&gestures_2);
        bVar12 = QGraphicsItem::isPanel((QGraphicsItem *)&DAT_aaaaaaaaaaaaaaba);
        ev.m_accepted.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
              )&DAT_aaaaaaaaaaaaaaaa;
        ev.m_targetWidgets.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
              )&DAT_aaaaaaaaaaaaaaaa;
        ev.m_gestures.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        ev.m_widget = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
        ev.m_gestures.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        ev.m_gestures.d.ptr = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
        ev._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ev._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QSet<QGesture_*>::values((QList<QGesture_*> *)&gesture,&gestures_2);
        QGestureEvent::QGestureEvent(&ev,(QList<QGesture_*> *)&gesture);
        QArrayDataPointer<QGesture_*>::~QArrayDataPointer((QArrayDataPointer<QGesture_*> *)&gesture)
        ;
        pQVar18 = QGestureEvent::widget(event);
        QGestureEvent::setWidget(&ev,pQVar18);
        if ((gestures_1.q_hash.d == (Data *)0x0) || (*(int *)((long)gestures_1.q_hash.d + 4) == 0))
        {
          puVar26 = (undefined1 *)0x0;
        }
        else {
          puVar26 = &DAT_aaaaaaaaaaaaaaaa;
        }
        pQVar28 = (QGraphicsItem *)(puVar26 + 0x10);
        if (puVar26 == (undefined1 *)0x0) {
          pQVar28 = (QGraphicsItem *)0x0;
        }
        sendEvent(this,pQVar28,&ev.super_QEvent);
        gestures.q_hash.d = (Hash)(Data *)0x0;
        ppQStack_120 = (QGraphicsObject **)&DAT_aaaaaaaaaaaaaaaa;
        gesture = (QGesture *)&DAT_aaaaaaaaaaaaaaaa;
        _gesture = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&gestures_2.q_hash);
        while( true ) {
          if (gesture == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
              gesture._8_8_ == 0) break;
          pSVar4 = gesture->spans;
          uVar37 = gesture._8_8_ >> 7;
          g = *(QGesture **)
               pSVar4[uVar37].entries[pSVar4[uVar37].offsets[gesture._8_4_ & 0x7f]].storage.data;
          if ((ev._12_1_ != '\0') || (bVar13 = QGestureEvent::isAccepted(&ev,g), bVar13)) {
            bVar13 = QPointer::operator_cast_to_bool((QPointer *)&gestures_1);
            if ((bVar13) && (GVar14 = QGesture::state(g), GVar14 == GestureStarted)) {
              if ((gestures_1.q_hash.d == (Data *)0x0) ||
                 (pDVar25 = pDStack_170, *(int *)((long)gestures_1.q_hash.d + 4) == 0)) {
                pDVar25 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                          (QGraphicsObject *)0x0;
              }
              ppQVar27 = QHash<QGesture_*,_QGraphicsObject_*>::operator[](this_02,&g);
              *ppQVar27 = (QGraphicsObject *)pDVar25;
            }
            QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                      ((QHash<QGesture*,QHashDummyValue> *)local_1f0,&g);
          }
          else {
            bVar13 = QPointer::operator_cast_to_bool((QPointer *)&gestures_1);
            if (bVar13) {
              if ((gestures_1.q_hash.d == (Data *)0x0) ||
                 (pDVar25 = pDStack_170, *(int *)((long)gestures_1.q_hash.d + 4) == 0)) {
                pDVar25 = (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)
                          (QGraphicsObject *)0x0;
              }
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uStack_1d0;
              _g_1 = (piter)(auVar9 << 0x40);
              pQVar20 = QHash<QGesture_*,_QGraphicsObject_*>::value
                                  (this_02,&g,(QGraphicsObject **)&g_1);
              if (pDVar25 ==
                  (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)pQVar20) {
                QSet<QGesture_*>::insert((QSet<QGesture_*> *)&g_1,(QGesture **)&gestures);
              }
            }
          }
          QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                    ((iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&gesture);
        }
        if ((local_1f0[0].d == (Data *)0x0) || ((local_1f0[0].d)->size == 0)) {
          iVar33 = 0x15;
        }
        else {
          iVar33 = 0;
          if ((gestures.q_hash.d != (Data *)0x0) &&
             (!bVar12 && *(long *)((long)gestures.q_hash.d + 8) != 0)) {
            g = (QGesture *)&DAT_aaaaaaaaaaaaaaaa;
            first.i = (this->cachedTargetItems).d.ptr;
            QSet<QGraphicsObject_*>::QSet<QList<QGraphicsObject_*>::const_iterator,_true>
                      ((QSet<QGraphicsObject_*> *)&g,first,
                       (const_iterator)(first.i + (this->cachedTargetItems).d.size));
            bVar12 = QPointer::operator_cast_to_bool((QPointer *)&gestures_1);
            if (bVar12) {
              ppQStack_120 = (QGraphicsObject **)&DAT_aaaaaaaaaaaaaaaa;
              gesture = (QGesture *)&DAT_aaaaaaaaaaaaaaaa;
              _gesture = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&gestures.q_hash);
              do {
                while( true ) {
                  if (gesture == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
                      gesture._8_8_ == 0) goto LAB_0059acbf;
                  pSVar4 = gesture->spans;
                  uVar37 = gesture._8_8_ >> 7;
                  bVar12 = QHash<QGesture_*,_QHashDummyValue>::contains
                                     (&local_1a8,
                                      (QGesture **)
                                      (pSVar4[uVar37].entries +
                                      pSVar4[uVar37].offsets[gesture._8_4_ & 0x7f]));
                  if (bVar12) break;
                  QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::
                  operator++((iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&gesture)
                  ;
                }
                lVar29 = ((ulong)ppQStack_120 >> 7) * 0x90;
                gesture_2 = *(QGesture **)
                             (*(long *)(*(long *)(gesture + 2) + 0x80 + lVar29) +
                             (ulong)*(byte *)((ulong)(gesture._8_4_ & 0x7f) +
                                             *(long *)(gesture + 2) + lVar29) * 8);
                gestureType = QGesture::gestureType(gesture_2);
                if ((gestures_1.q_hash.d == (Data *)0x0) ||
                   (*(int *)((long)gestures_1.q_hash.d + 4) == 0)) {
                  pQVar28 = (QGraphicsItem *)0x0;
                }
                else {
                  pQVar28 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaba;
                }
                for (; pQVar28 != (QGraphicsItem *)0x0; pQVar28 = QGraphicsItem::parentItem(pQVar28)
                    ) {
                  obj = QGraphicsItem::toGraphicsObject(pQVar28);
                  if ((obj != (QGraphicsObject *)0x0) &&
                     (bVar12 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::contains
                                         (&((pQVar28->d_ptr).d)->gestureContext,&gestureType),
                     bVar12)) {
                    QSet<QGraphicsObject_*>::insert
                              ((QSet<QGraphicsObject_*> *)&g_1,(QGraphicsObject **)&g);
                    pQVar24 = QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[](pQVar1,&obj);
                    QSet<QGesture_*>::insert((QSet<QGesture_*> *)&g_1,(QGesture **)pQVar24);
                  }
                  bVar12 = QGraphicsItem::isPanel(pQVar28);
                  if (bVar12) break;
                }
                _gesture = (piter)QHash<QGesture_*,_QHashDummyValue>::erase
                                            (&gestures.q_hash,(const_iterator)_gesture);
              } while( true );
            }
LAB_0059acbf:
            gestureTargetsAtHotSpots
                      (this,&gestures,ReceivePartialGestures,pQVar1,(QSet<QGraphicsObject_*> *)&g,
                       (QSet<QGesture_*> *)0x0,(QSet<QGesture_*> *)0x0);
            QSet<QGraphicsObject_*>::values
                      ((QList<QGraphicsObject_*> *)&gesture,(QSet<QGraphicsObject_*> *)&g);
            QArrayDataPointer<QGraphicsObject_*>::operator=
                      (&pQVar36->d,(QArrayDataPointer<QGraphicsObject_*> *)&gesture);
            QArrayDataPointer<QGraphicsObject_*>::~QArrayDataPointer
                      ((QArrayDataPointer<QGraphicsObject_*> *)&gesture);
            iVar21 = QList<QGraphicsObject_*>::begin(pQVar36);
            iVar22 = QList<QGraphicsObject_*>::end(pQVar36);
            std::
            __sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                      (iVar21,iVar22,
                       (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                       0x581e1c);
            QHash<QGraphicsObject_*,_QHashDummyValue>::~QHash
                      ((QHash<QGraphicsObject_*,_QHashDummyValue> *)&g);
            iVar34 = -1;
            iVar33 = 0x17;
          }
        }
        QHash<QGesture_*,_QHashDummyValue>::~QHash(&gestures.q_hash);
        QGestureEvent::~QGestureEvent(&ev);
        QHash<QGesture_*,_QHashDummyValue>::~QHash(&gestures_2.q_hash);
        QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&gestures_1);
        if ((iVar33 != 0x17) && (iVar33 != 0)) break;
      }
      iVar34 = iVar34 + 1;
    }
    ev._0_16_ = QHash<QGesture_*,_QHashDummyValue>::begin(&local_1a0);
    while( true ) {
      ppQVar11 = local_198.ptr;
      if (ev._0_8_ == 0 && ev._8_8_ == 0) break;
      lVar29 = *(long *)(ev._0_8_ + 0x20);
      lVar35 = (ev._8_8_ >> 7) * 0x90;
      this_00 = *(QGesture **)
                 (*(long *)(lVar29 + 0x80 + lVar35) +
                 (ulong)*(byte *)((ulong)(ev._8_4_ & 0x7f) + lVar29 + lVar35) * 8);
      GVar17 = QGesture::gestureCancelPolicy(this_00);
      if (GVar17 == CancelAllInContext) {
        cancelGesturesForChildren(this,this_00);
      }
      QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
                ((iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&ev);
    }
    lVar35 = local_198.size << 3;
    for (lVar29 = 0; lVar35 != lVar29; lVar29 = lVar29 + 8) {
      ev._0_8_ = *(QGesture **)((long)ppQVar11 + lVar29);
      GVar14 = QGesture::state(*(QGesture **)((long)ppQVar11 + lVar29));
      if (GVar14 - GestureFinished < 2) {
        QHash<QGesture*,QGraphicsObject*>::removeImpl<QGesture*>
                  ((QHash<QGesture*,QGraphicsObject*> *)this_02,(QGesture **)&ev);
      }
    }
    QList<QGraphicsObject_*>::clear(pQVar36);
    QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::clear(pQVar1);
    QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::clear(this_03);
    QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a8);
    QHash<QGesture_*,_QHashDummyValue>::~QHash(local_1f0);
    QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a0);
    QArrayDataPointer<QGesture_*>::~QArrayDataPointer(&local_198);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::gestureEventHandler(QGestureEvent *event)
{
    QWidget *viewport = event->widget();
    if (!viewport)
        return;
    QGraphicsView *graphicsView = qobject_cast<QGraphicsView *>(viewport->parent());
    if (!graphicsView)
        return;

    const QList<QGesture *> allGestures = event->gestures();
    DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
            << "Gestures:" <<  allGestures;

    QSet<QGesture *> startedGestures;
    QPoint delta = viewport->mapFromGlobal(QPoint());
    QTransform toScene = QTransform::fromTranslate(delta.x(), delta.y())
                         * graphicsView->viewportTransform().inverted();
    for (QGesture *gesture : allGestures) {
        // cache scene coordinates of the hot spot
        if (gesture->hasHotSpot()) {
            gesture->d_func()->sceneHotSpot = toScene.map(gesture->hotSpot());
        } else {
            gesture->d_func()->sceneHotSpot = QPointF();
        }

        QGraphicsObject *target = gestureTargets.value(gesture, 0);
        if (!target) {
            // when we are not in started mode but don't have a target
            // then the only one interested in gesture is the view/scene
            if (gesture->state() == Qt::GestureStarted)
                startedGestures.insert(gesture);
        }
    }

    if (!startedGestures.isEmpty()) {
        QSet<QGesture *> normalGestures; // that have just one target
        QSet<QGesture *> conflictedGestures; // that have multiple possible targets
        gestureTargetsAtHotSpots(startedGestures, Qt::GestureFlag(0), &cachedItemGestures, nullptr,
                                 &normalGestures, &conflictedGestures);
        cachedTargetItems = cachedItemGestures.keys();
        std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                << "Normal gestures:" << normalGestures
                << "Conflicting gestures:" << conflictedGestures;

        // deliver conflicted gestures as override events AND remember
        // initial gesture targets
        if (!conflictedGestures.isEmpty()) {
            for (int i = 0; i < cachedTargetItems.size(); ++i) {
                QPointer<QGraphicsObject> item = cachedTargetItems.at(i);

                // get gestures to deliver to the current item
                const QSet<QGesture *> gestures = conflictedGestures & cachedItemGestures.value(item.data());
                if (gestures.isEmpty())
                    continue;

                DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                        << "delivering override to"
                        << item.data() << gestures;
                // send gesture override
                QGestureEvent ev(gestures.values());
                ev.t = QEvent::GestureOverride;
                ev.setWidget(event->widget());
                // mark event and individual gestures as ignored
                ev.ignore();
                for (QGesture *g : gestures)
                    ev.setAccepted(g, false);
                sendEvent(item.data(), &ev);
                // mark all accepted gestures to deliver them as normal gesture events
                for (QGesture *g : gestures) {
                    if (ev.isAccepted() || ev.isAccepted(g)) {
                        conflictedGestures.remove(g);
                        // mark the item as a gesture target
                        if (item) {
                            gestureTargets.insert(g, item.data());
                            QHash<QGraphicsObject *, QSet<QGesture *> >::iterator it, e;
                            it = cachedItemGestures.begin();
                            e = cachedItemGestures.end();
                            for(; it != e; ++it)
                                it.value().remove(g);
                            cachedItemGestures[item.data()].insert(g);
                        }
                        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                                << "override was accepted:"
                                << g << item.data();
                    }
                    // remember the first item that received the override event
                    // as it most likely become a target if no one else accepts
                    // the override event
                    if (!gestureTargets.contains(g) && item)
                        gestureTargets.insert(g, item.data());

                }
                if (conflictedGestures.isEmpty())
                    break;
            }
        }
        // remember the initial target item for each gesture that was not in
        // the conflicted state.
        if (!normalGestures.isEmpty()) {
            for (int i = 0; i < cachedTargetItems.size() && !normalGestures.isEmpty(); ++i) {
                QGraphicsObject *item = cachedTargetItems.at(i);

                // get gestures to deliver to the current item
                const auto gestures = cachedItemGestures.value(item);
                for (QGesture *g : gestures) {
                    if (!gestureTargets.contains(g)) {
                        gestureTargets.insert(g, item);
                        normalGestures.remove(g);
                    }
                }
            }
        }
    }


    // deliver all gesture events
    QSet<QGesture *> undeliveredGestures;
    QSet<QGesture *> parentPropagatedGestures;
    for (QGesture *gesture : allGestures) {
        if (QGraphicsObject *target = gestureTargets.value(gesture, 0)) {
            cachedItemGestures[target].insert(gesture);
            cachedTargetItems.append(target);
            undeliveredGestures.insert(gesture);
            QGraphicsItemPrivate *d = target->QGraphicsItem::d_func();
            const Qt::GestureFlags flags = d->gestureContext.value(gesture->gestureType());
            if (flags & Qt::IgnoredGesturesPropagateToParent)
                parentPropagatedGestures.insert(gesture);
        } else {
            DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                    << "no target for" << gesture << "at"
                    << gesture->hotSpot() << gesture->d_func()->sceneHotSpot;
        }
    }
    std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
    for (int i = 0; i < cachedTargetItems.size(); ++i) {
        QPointer<QGraphicsObject> receiver = cachedTargetItems.at(i);
        const QSet<QGesture *> gestures = (undeliveredGestures
                                        & cachedItemGestures.value(receiver.data()))
                                        - cachedAlreadyDeliveredGestures.value(receiver.data());

        if (gestures.isEmpty())
            continue;

        cachedAlreadyDeliveredGestures[receiver.data()] += gestures;
        const bool isPanel = receiver.data()->isPanel();

        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                << "delivering to"
                << receiver.data() << gestures;
        QGestureEvent ev(gestures.values());
        ev.setWidget(event->widget());
        sendEvent(receiver.data(), &ev);
        QSet<QGesture *> ignoredGestures;
        for (QGesture *g : gestures) {
            if (!ev.isAccepted() && !ev.isAccepted(g)) {
                // if the gesture was ignored by its target, we will update the
                // targetItems list with a possible target items (items that
                // want to receive partial gestures).
                // ### won't work if the target was destroyed in the event
                //     we will just stop delivering it.
                if (receiver && receiver.data() == gestureTargets.value(g, 0))
                    ignoredGestures.insert(g);
            } else {
                if (receiver && g->state() == Qt::GestureStarted) {
                    // someone accepted the propagated initial GestureStarted
                    // event, let it be the new target for all following events.
                    gestureTargets[g] = receiver.data();
                }
                undeliveredGestures.remove(g);
            }
        }
        if (undeliveredGestures.isEmpty())
            break;

        // ignoredGestures list is only filled when delivering to the gesture
        // target item, so it is safe to assume item == target.
        if (!ignoredGestures.isEmpty() && !isPanel) {
            // look for new potential targets for gestures that were ignored
            // and should be propagated.

            QSet<QGraphicsObject *> targetsSet(cachedTargetItems.constBegin(), cachedTargetItems.constEnd());

            if (receiver) {
                // first if the gesture should be propagated to parents only
                for (QSet<QGesture *>::iterator it = ignoredGestures.begin();
                     it != ignoredGestures.end();) {
                    if (parentPropagatedGestures.contains(*it)) {
                        QGesture *gesture = *it;
                        const Qt::GestureType gestureType = gesture->gestureType();
                        QGraphicsItem *item = receiver.data();
                        while (item) {
                            if (QGraphicsObject *obj = item->toGraphicsObject()) {
                                if (item->d_func()->gestureContext.contains(gestureType)) {
                                    targetsSet.insert(obj);
                                    cachedItemGestures[obj].insert(gesture);
                                }
                            }
                            if (item->isPanel())
                                break;
                            item = item->parentItem();
                        }

                        it = ignoredGestures.erase(it);
                        continue;
                    }
                    ++it;
                }
            }

            gestureTargetsAtHotSpots(ignoredGestures, Qt::ReceivePartialGestures,
                                     &cachedItemGestures, &targetsSet, nullptr, nullptr);

            cachedTargetItems = targetsSet.values();
            std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
            DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                    << "new targets:" << cachedTargetItems;
            i = -1; // start delivery again
            continue;
        }
    }

    for (QGesture *g : std::as_const(startedGestures)) {
        if (g->gestureCancelPolicy() == QGesture::CancelAllInContext) {
            DEBUG() << "lets try to cancel some";
            // find gestures in context in Qt::GestureStarted or Qt::GestureUpdated state and cancel them
            cancelGesturesForChildren(g);
        }
    }

    // forget about targets for gestures that have ended
    for (QGesture *g : allGestures) {
        switch (g->state()) {
        case Qt::GestureFinished:
        case Qt::GestureCanceled:
            gestureTargets.remove(g);
            break;
        default:
            break;
        }
    }

    cachedTargetItems.clear();
    cachedItemGestures.clear();
    cachedAlreadyDeliveredGestures.clear();
}